

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smooth_triangle.cpp
# Opt level: O3

Tuple4d * __thiscall
geometry::primitive::SmoothTriangle::local_normal
          (Tuple4d *__return_storage_ptr__,SmoothTriangle *this,Tuple4d *point,Intersection *hit)

{
  double s;
  double s_00;
  Tuple4d local_a8;
  Tuple4d local_88;
  Tuple4d local_68;
  Tuple4d local_48;
  
  s = (hit->m_uv).first;
  s_00 = (hit->m_uv).second;
  math::operator*(&local_68,(Tuple4d *)&this->field_0x180,s);
  math::operator*(&local_88,(Tuple4d *)&this->field_0x1a0,s_00);
  math::operator+(&local_68,&local_88);
  math::operator*(&local_a8,(Tuple4d *)&this->field_0x160,(1.0 - s) - s_00);
  math::operator+(&local_48,&local_a8);
  return __return_storage_ptr__;
}

Assistant:

math::Tuple4d geometry::primitive::SmoothTriangle::local_normal(const math::Tuple4d &point, const core::Intersection &hit) const
{
    double u = hit.uv().first, v = hit.uv().second;
    return m_normals[1] * u + m_normals[2] * v + m_normals[0] * (1 - u - v);
}